

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::Apply(Builder *this,VersionEdit *edit)

{
  long lVar1;
  bool bVar2;
  FileMetaData *pFVar3;
  size_type sVar4;
  FileMetaData *in_RDI;
  long in_FS_OFFSET;
  int level_2;
  size_t i_1;
  int level_1;
  pair<int,_unsigned_long> *deleted_file_set_kvp;
  DeletedFileSet *__range2;
  int level;
  size_t i;
  FileMetaData *f;
  uint64_t number;
  iterator __end2;
  iterator __begin2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  *in_stack_ffffffffffffff00;
  set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffff08;
  FileMetaData *pFVar5;
  Slice *in_stack_ffffffffffffff38;
  ulong local_b8;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  FileMetaData *local_90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = (FileMetaData *)0x0;
  while( true ) {
    pFVar5 = local_90;
    pFVar3 = (FileMetaData *)
             std::
             vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ::size((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                     *)in_stack_fffffffffffffef8);
    if (pFVar3 <= pFVar5) break;
    std::
    vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                  *)in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00);
    std::
    vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                  *)in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00);
    InternalKey::Encode((InternalKey *)in_stack_ffffffffffffff08);
    Slice::ToString_abi_cxx11_(in_stack_ffffffffffffff38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    std::__cxx11::string::~string(in_stack_fffffffffffffef8);
    local_90 = (FileMetaData *)((long)&local_90->refs + 1);
  }
  std::
  set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::begin(in_stack_ffffffffffffff00);
  std::
  set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::end(in_stack_ffffffffffffff00);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff08,(_Self *)in_stack_ffffffffffffff00);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *)in_stack_fffffffffffffef8)
    ;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               in_stack_ffffffffffffff08,(value_type_conflict *)in_stack_ffffffffffffff00);
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *)in_stack_fffffffffffffef8)
    ;
  }
  local_b8 = 0;
  while( true ) {
    sVar4 = std::
            vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
            ::size((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    *)in_stack_fffffffffffffef8);
    if (sVar4 <= local_b8) break;
    std::
    vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                  *)in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00);
    in_stack_ffffffffffffff08 =
         (set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
          *)operator_new(0x58);
    std::
    vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                  *)in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00);
    FileMetaData::FileMetaData(in_RDI,pFVar5);
    *(undefined4 *)
     &(in_stack_ffffffffffffff08->_M_t)._M_impl.
      super__Rb_tree_key_compare<leveldb::VersionSet::Builder::BySmallestKey>._M_key_compare.
      internal_comparator = 1;
    *(int *)((long)&(in_stack_ffffffffffffff08->_M_t)._M_impl.
                    super__Rb_tree_key_compare<leveldb::VersionSet::Builder::BySmallestKey>.
                    _M_key_compare.internal_comparator + 4) =
         (int)((ulong)(in_stack_ffffffffffffff08->_M_t)._M_impl.super__Rb_tree_header._M_header.
                      _M_parent >> 0xe);
    if (*(int *)((long)&(in_stack_ffffffffffffff08->_M_t)._M_impl.
                        super__Rb_tree_key_compare<leveldb::VersionSet::Builder::BySmallestKey>.
                        _M_key_compare.internal_comparator + 4) < 100) {
      *(undefined4 *)
       ((long)&(in_stack_ffffffffffffff08->_M_t)._M_impl.
               super__Rb_tree_key_compare<leveldb::VersionSet::Builder::BySmallestKey>.
               _M_key_compare.internal_comparator + 4) = 100;
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               in_stack_ffffffffffffff08,(key_type *)in_stack_ffffffffffffff00);
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::insert(in_stack_ffffffffffffff08,(value_type *)in_stack_ffffffffffffff00);
    local_b8 = local_b8 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Apply(VersionEdit* edit) {
    // Update compaction pointers
    for (size_t i = 0; i < edit->compact_pointers_.size(); i++) {
      const int level = edit->compact_pointers_[i].first;
      vset_->compact_pointer_[level] =
          edit->compact_pointers_[i].second.Encode().ToString();
    }

    // Delete files
    for (const auto& deleted_file_set_kvp : edit->deleted_files_) {
      const int level = deleted_file_set_kvp.first;
      const uint64_t number = deleted_file_set_kvp.second;
      levels_[level].deleted_files.insert(number);
    }

    // Add new files
    for (size_t i = 0; i < edit->new_files_.size(); i++) {
      const int level = edit->new_files_[i].first;
      FileMetaData* f = new FileMetaData(edit->new_files_[i].second);
      f->refs = 1;

      // We arrange to automatically compact this file after
      // a certain number of seeks.  Let's assume:
      //   (1) One seek costs 10ms
      //   (2) Writing or reading 1MB costs 10ms (100MB/s)
      //   (3) A compaction of 1MB does 25MB of IO:
      //         1MB read from this level
      //         10-12MB read from next level (boundaries may be misaligned)
      //         10-12MB written to next level
      // This implies that 25 seeks cost the same as the compaction
      // of 1MB of data.  I.e., one seek costs approximately the
      // same as the compaction of 40KB of data.  We are a little
      // conservative and allow approximately one seek for every 16KB
      // of data before triggering a compaction.
      f->allowed_seeks = static_cast<int>((f->file_size / 16384U));
      if (f->allowed_seeks < 100) f->allowed_seeks = 100;

      levels_[level].deleted_files.erase(f->number);
      levels_[level].added_files->insert(f);
    }
  }